

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O1

BN * __thiscall
BN::expSlidingWindow
          (BN *__return_storage_ptr__,BN *this,BN *exponent,BN *mod,
          vector<BN,_std::allocator<BN>_> *g,size_t K)

{
  ulong uVar1;
  ushort uVar2;
  pointer puVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long local_88;
  BN local_78;
  BN local_60;
  BN *local_48;
  vector<BN,_std::allocator<BN>_> *local_40;
  size_t local_38;
  
  local_40 = g;
  local_38 = K;
  bn1();
  puVar3 = (exponent->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar2 = puVar3[-1];
  if (uVar2 == 0) {
    iVar8 = -0x10;
  }
  else {
    uVar4 = 0xf;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    iVar8 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 0x10;
  }
  uVar6 = (iVar8 + ((int)puVar3 -
                   *(int *)&(exponent->ba).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start) * 8) - 1;
  local_48 = exponent;
  while (-1 < (int)uVar6) {
    uVar12 = (ulong)uVar6;
    puVar3 = (exponent->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = ((long)(exponent->ba).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar3) * 8;
    if ((uVar12 < uVar7) && ((puVar3[uVar6 >> 4] >> (uVar6 & 0xf) & 1) != 0)) {
      iVar8 = uVar6 - (int)local_38;
      if (iVar8 < 0) {
        iVar8 = -1;
      }
      lVar9 = (long)iVar8 << 0x20;
      iVar10 = uVar6 - iVar8;
      uVar14 = (long)iVar8;
      while ((uVar1 = uVar14 + 1, uVar7 <= uVar1 ||
             (uVar5 = (uint)uVar14, (puVar3[uVar1 >> 4] >> (uVar5 + 1 & 0xf) & 1) == 0))) {
        lVar9 = lVar9 + 0x100000000;
        iVar10 = iVar10 + -1;
        uVar14 = uVar1;
      }
      if ((int)uVar5 < (int)uVar6) {
        uVar11 = 0;
        do {
          uVar13 = 0;
          if (uVar12 < uVar7) {
            uVar13 = (uint)((puVar3[uVar12 >> 4] >> ((uint)uVar12 & 0xf) & 1) != 0);
          }
          uVar11 = uVar11 * 2 | uVar13;
          uVar12 = uVar12 - 1;
        } while (lVar9 >> 0x20 < (long)uVar12);
        local_88 = (long)(int)uVar11;
      }
      else {
        local_88 = 0;
      }
      if ((int)(uVar5 + 1) <= (int)uVar6) {
        do {
          Qrt(&local_78,__return_storage_ptr__);
          operator%(&local_60,&local_78,mod);
          if (&local_60 != __return_storage_ptr__) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                      (&__return_storage_ptr__->ba,&local_60.ba);
          }
          if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      karatsubaMultiplication
                (&local_78,__return_storage_ptr__,
                 (local_40->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                 super__Vector_impl_data._M_start + local_88);
      operator%(&local_60,&local_78,mod);
      if (&local_60 != __return_storage_ptr__) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                  (&__return_storage_ptr__->ba,&local_60.ba);
      }
      if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar6 = uVar5;
      exponent = local_48;
      if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
        exponent = local_48;
      }
    }
    else {
      Qrt(&local_78,__return_storage_ptr__);
      operator%(&local_60,&local_78,mod);
      if (&local_60 != __return_storage_ptr__) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                  (&__return_storage_ptr__->ba,&local_60.ba);
      }
      if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar6 = uVar6 - 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::expSlidingWindow(const BN& exponent, const BN& mod, const vector<BN>& g, size_t K) const {
    BN A(BN::bn1());
    int i = exponent.bitCount() - 1;
    while (i >= 0) {
        if(exponent.bitI(i) == 0) {
            A = A.Qrt() % mod;
            i--;
            continue;
        }
        int l = max(i - static_cast<int>(K) + 1, 0);
        while(exponent.bitI(l) == 0)
            l++;

        int gx = 0;
        for(int j = i; j >= l; j--)
            gx = (gx << 1) | exponent.bitI(j);
        for(int j = 0; j < i - l + 1; j++)
            A = A.Qrt() % mod;
        A = A * g[gx] % mod;
        i = l - 1;
    }
    return A;
}